

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

bool __thiscall libcellml::Generator::GeneratorImpl::modifiedProfile(GeneratorImpl *this)

{
  bool bVar1;
  Profile PVar2;
  element_type *this_00;
  GeneratorProfilePtr *in_RDX;
  string local_90;
  byte local_69;
  string local_68;
  undefined1 local_38 [8];
  string profileContents;
  GeneratorImpl *this_local;
  
  profileContents.field_2._8_8_ = this;
  generatorProfileAsString_abi_cxx11_((string *)local_38,(libcellml *)&this->mProfile,in_RDX);
  this_00 = std::
            __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mProfile);
  local_69 = 0;
  PVar2 = GeneratorProfile::profile(this_00);
  if (PVar2 == C) {
    sha1(&local_68,(string *)local_38);
    local_69 = 1;
    bVar1 = std::operator!=(&local_68,C_GENERATOR_PROFILE_SHA1);
  }
  else {
    sha1(&local_90,(string *)local_38);
    bVar1 = std::operator!=(&local_90,PYTHON_GENERATOR_PROFILE_SHA1);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool Generator::GeneratorImpl::modifiedProfile() const
{
    std::string profileContents = generatorProfileAsString(mProfile);

    return (mProfile->profile() == GeneratorProfile::Profile::C) ?
               sha1(profileContents) != C_GENERATOR_PROFILE_SHA1 :
               sha1(profileContents) != PYTHON_GENERATOR_PROFILE_SHA1;
}